

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float f;
  double f_00;
  string *enum_name;
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  LogMessage *other;
  EnumValueDescriptor *pEVar4;
  AlphaNum *extraout_RDX;
  AlphaNum *extraout_RDX_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  EnumDescriptor *descriptor_00;
  AlphaNum *a_04;
  AlphaNum *a_05;
  AlphaNum *a_06;
  char *pcVar5;
  string local_90;
  LogMessage local_70;
  string local_38;
  
LAB_002ed0d5:
  TVar2 = FieldDescriptor::type(descriptor);
  switch(TVar2) {
  case TYPE_DOUBLE:
    f_00 = *(double *)(descriptor + 0x40);
    if (INFINITY <= f_00) {
      pcVar5 = "double.PositiveInfinity";
    }
    else if (f_00 <= -INFINITY) {
      pcVar5 = "double.NegativeInfinity";
    }
    else {
      if (!NAN(f_00)) {
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,f_00);
        StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_05);
        std::operator+(__return_storage_ptr__,&local_90,"D");
LAB_002ed39c:
        std::__cxx11::string::~string((string *)&local_90);
        return __return_storage_ptr__;
      }
      pcVar5 = "double.NaN";
    }
LAB_002ed3dc:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&local_70);
    return __return_storage_ptr__;
  case TYPE_FLOAT:
    f = *(float *)(descriptor + 0x40);
    if (INFINITY <= f) {
      pcVar5 = "float.PositiveInfinity";
      goto LAB_002ed3dc;
    }
    if (f <= -INFINITY) {
      pcVar5 = "float.NegativeInfinity";
      goto LAB_002ed3dc;
    }
    if (NAN(f)) {
      pcVar5 = "float.NaN";
      goto LAB_002ed3dc;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,f);
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_06);
    std::operator+(__return_storage_ptr__,&local_90,"F");
    goto LAB_002ed39c;
  case TYPE_INT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(long *)(descriptor + 0x40));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_01);
    std::operator+(__return_storage_ptr__,&local_90,"L");
    goto LAB_002ed39c;
  case TYPE_UINT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(unsigned_long *)(descriptor + 0x40));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_00);
    std::operator+(__return_storage_ptr__,&local_90,"UL");
    goto LAB_002ed39c;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(int *)(descriptor + 0x40));
    a = extraout_RDX;
    break;
  case TYPE_FIXED64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(unsigned_long *)(descriptor + 0x40));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_02);
    std::operator+(__return_storage_ptr__,&local_90,"UL");
    goto LAB_002ed39c;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(uint *)(descriptor + 0x40));
    a = extraout_RDX_00;
    break;
  case TYPE_BOOL:
    if (descriptor[0x40] == (FieldDescriptor)0x1) {
      pcVar5 = "true";
    }
    else {
      pcVar5 = "false";
    }
    goto LAB_002ed3dc;
  case TYPE_STRING:
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar1 = IsWrapperType(descriptor);
    if (bVar1) goto code_r0x002ed0f9;
    pcVar5 = "null";
    goto LAB_002ed3dc;
  case TYPE_BYTES:
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case TYPE_ENUM:
    pEVar4 = FieldDescriptor::default_value_enum(descriptor);
    GetClassName_abi_cxx11_(&local_90,*(csharp **)(pEVar4 + 0x10),descriptor_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_90,".");
    pEVar4 = FieldDescriptor::default_value_enum(descriptor);
    enum_name = *(string **)(*(long *)(pEVar4 + 0x10) + 8);
    pEVar4 = FieldDescriptor::default_value_enum(descriptor);
    GetEnumValueName(&local_38,enum_name,*(string **)(pEVar4 + 8));
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_70);
    goto LAB_002ed39c;
  case TYPE_SFIXED64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(long *)(descriptor + 0x40));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_04);
    std::operator+(__return_storage_ptr__,&local_90,"L");
    goto LAB_002ed39c;
  case MAX_TYPE:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_70,*(long *)(descriptor + 0x40));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,a_03);
    std::operator+(__return_storage_ptr__,&local_90,"L");
    goto LAB_002ed39c;
  default:
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x193);
    other = internal::LogMessage::operator<<(&local_70,"Unknown field type.");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
    internal::LogMessage::~LogMessage(&local_70);
    pcVar5 = "";
    goto LAB_002ed3dc;
  }
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_70,a);
  return __return_storage_ptr__;
code_r0x002ed0f9:
  pDVar3 = FieldDescriptor::message_type(descriptor);
  descriptor = *(FieldDescriptor **)(pDVar3 + 0x28);
  goto LAB_002ed0d5;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->default_value_enum()->type()) + "." +
        GetEnumValueName(descriptor->default_value_enum()->type()->name(), descriptor->default_value_enum()->name());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return StrCat(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return StrCat(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}